

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessVertexArraysTests.cpp
# Opt level: O2

IterateResult __thiscall
gl4cts::DirectStateAccess::VertexArrays::AttributeBindingDivisorTest::iterate
          (AttributeBindingDivisorTest *this)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  ContextType ctxType;
  int iVar4;
  GLint in_RAX [2];
  undefined4 extraout_var;
  char *description;
  qpTestResult testResult;
  TestContext *this_00;
  GLint reference [2];
  
  reference = in_RAX;
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x154);
  bVar2 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_direct_state_access")
  ;
  if ((bVar1) || (bVar2)) {
    PrepareProgram(this);
    PrepareVAO(this);
    PrepareXFB(this);
    reference[0] = 0;
    reference[1] = 2;
    SetDivisor(this,2);
    Draw(this,1,2);
    CheckXFB(this,2,reference,"Draw of 1 point with 2 instances with 2 divisor has failed.");
    SetDivisor(this,1);
    Draw(this,2,2);
    CheckXFB(this,4,(GLint *)&DAT_01710da0,
             "Draw of 2 points with 2 instances with 1 divisor has failed.");
    SetDivisor(this,1);
    Draw(this,1,4);
    CheckXFB(this,4,&deqp::gles31::Functional::(anonymous_namespace)::
                     randomInterpolation(de::Random&)::s_validInterpolations,
             "Draw of 1 point with 4 instances with 1 divisor has failed.");
    SetDivisor(this,0);
    Draw(this,2,2);
    CheckXFB(this,4,(GLint *)&DAT_016b91b0,
             "Draw of 2 points with 2 instances with 0 divisor has failed.");
    SetDivisor(this,0);
    Draw(this,4,1);
    bVar1 = CheckXFB(this,4,&deqp::gles31::Functional::(anonymous_namespace)::
                             randomInterpolation(de::Random&)::s_validInterpolations,
                     "Draw of 4 points with 1 instance with 0 divisor has failed.");
    Clean(this);
    do {
      iVar4 = (**(code **)(CONCAT44(extraout_var,iVar3) + 0x800))();
    } while (iVar4 != 0);
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    if (bVar1) {
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
    }
    else {
      description = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
    }
  }
  else {
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Not Supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  tcu::TestContext::setTestResult(this_00,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult AttributeBindingDivisorTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	try
	{
		PrepareProgram();
		PrepareVAO();
		PrepareXFB();

		{
			glw::GLint reference[] = { 0, 2 };
			is_ok				   = SetDivisor(2);
			Draw(1, 2);
			is_ok = CheckXFB((sizeof(reference) / sizeof(reference[0])), reference,
							 "Draw of 1 point with 2 instances with 2 divisor has failed.");
		}

		{
			glw::GLint reference[] = { 0, 0, 1, 1 };
			is_ok				   = SetDivisor(1);
			Draw(2, 2);
			is_ok = CheckXFB((sizeof(reference) / sizeof(reference[0])), reference,
							 "Draw of 2 points with 2 instances with 1 divisor has failed.");
		}

		{
			glw::GLint reference[] = { 0, 1, 2, 3 };
			is_ok				   = SetDivisor(1);
			Draw(1, 4);
			is_ok = CheckXFB((sizeof(reference) / sizeof(reference[0])), reference,
							 "Draw of 1 point with 4 instances with 1 divisor has failed.");
		}

		{
			glw::GLint reference[] = { 0, 1, 0, 1 };
			is_ok				   = SetDivisor(0);
			Draw(2, 2);
			is_ok = CheckXFB((sizeof(reference) / sizeof(reference[0])), reference,
							 "Draw of 2 points with 2 instances with 0 divisor has failed.");
		}

		{
			glw::GLint reference[] = { 0, 1, 2, 3 };
			is_ok				   = SetDivisor(0);
			Draw(4, 1);
			is_ok = CheckXFB((sizeof(reference) / sizeof(reference[0])), reference,
							 "Draw of 4 points with 1 instance with 0 divisor has failed.");
		}
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Cleanup. */
	Clean();

	/* Errors clean up. */
	while (gl.getError())
		;

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}